

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  undefined4 uVar4;
  uchar secret [8];
  uchar ad [12];
  uchar salt [16];
  uchar pwd [32];
  uchar out [32];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [40];
  undefined1 *local_80;
  undefined4 local_78;
  undefined8 *local_70;
  undefined4 local_68;
  undefined8 *local_60;
  undefined4 local_58;
  undefined8 *local_50;
  undefined4 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  int local_24;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  if (argc < 2) {
    pcVar2 = "i";
  }
  else {
    pcVar2 = argv[1];
  }
  if (*pcVar2 == 'i') {
    if (pcVar2[1] != '\0') {
      if (pcVar2[1] == 'd') {
        uVar4 = 2;
        cVar1 = pcVar2[2];
        goto joined_r0x00101202;
      }
      goto LAB_00101204;
    }
  }
  else {
    if (*pcVar2 == 'd') {
      uVar4 = 0;
      cVar1 = pcVar2[1];
joined_r0x00101202:
      if (cVar1 == '\0') goto LAB_0010120e;
    }
LAB_00101204:
    main_cold_2();
  }
  uVar4 = 1;
LAB_0010120e:
  local_24 = 0x13;
  if (2 < argc) {
    uVar3 = strtoul(argv[2],(char **)0x0,10);
    local_24 = (int)uVar3;
    if ((local_24 != 0x10) && (local_24 != 0x13)) {
      main_cold_1();
      halt_baddata();
    }
  }
  local_70 = &local_c8;
  local_c8 = 0x101010101010101;
  uStack_c0 = 0x101010101010101;
  local_b8 = 0x101010101010101;
  uStack_b0 = 0x101010101010101;
  local_60 = &local_d8;
  local_d8 = 0x202020202020202;
  uStack_d0 = 0x202020202020202;
  local_50 = &local_f0;
  local_f0 = 0x303030303030303;
  local_40 = &local_e8;
  local_e8 = 0x404040404040404;
  local_e0 = 0x4040404;
  local_80 = local_a8;
  local_78 = 0x20;
  local_68 = 0x20;
  local_58 = 0x10;
  local_48 = 8;
  local_38 = 0x30000000c;
  uStack_30 = 0x400000020;
  local_28 = 4;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 8;
  argon2_ctx(&local_80,uVar4);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    /* Get and check Argon2 type */
    const char *type_str = (argc > 1) ? argv[1] : "i";
    argon2_type type = Argon2_i;
    uint32_t version = ARGON2_VERSION_NUMBER;
    if (!strcmp(type_str, "d")) {
        type = Argon2_d;
    } else if (!strcmp(type_str, "i")) {
        type = Argon2_i;
    } else if (!strcmp(type_str, "id")) {
        type = Argon2_id;
    } else {
        fatal("wrong Argon2 type");
    }

    /* Get and check Argon2 version number */
    if(argc > 2) {
        version = strtoul(argv[2], NULL, 10);
    }
    if (ARGON2_VERSION_10 != version && ARGON2_VERSION_NUMBER != version) {
        fatal("wrong Argon2 version number");
    }

    generate_testvectors(type, version);
    return ARGON2_OK;
}